

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

void fsg_model_writefile_symtab(fsg_model_t *fsg,char *file)

{
  FILE *__stream;
  FILE *fp;
  char *file_local;
  fsg_model_t *fsg_local;
  
  if (fsg != (fsg_model_t *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x393,"Writing FSM symbol table \'%s\'\n",file);
    __stream = fopen(file,"w");
    if (__stream == (FILE *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x396,"Failed to open symbol table \'%s\' for writing",file);
    }
    else {
      fsg_model_write_symtab(fsg,(FILE *)__stream);
      fclose(__stream);
    }
    return;
  }
  __assert_fail("fsg",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x391,"void fsg_model_writefile_symtab(fsg_model_t *, const char *)");
}

Assistant:

void
fsg_model_writefile_symtab(fsg_model_t * fsg, char const *file)
{
    FILE *fp;

    assert(fsg);

    E_INFO("Writing FSM symbol table '%s'\n", file);

    if ((fp = fopen(file, "w")) == NULL) {
        E_ERROR("Failed to open symbol table '%s' for writing", file);
        return;
    }

    fsg_model_write_symtab(fsg, fp);

    fclose(fp);
}